

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override.hpp
# Opt level: O1

method_result __thiscall boost::python::override::operator()(override *this,uint *a0)

{
  undefined8 uVar1;
  long *plVar2;
  long lVar3;
  undefined4 *in_RDX;
  
  uVar1 = *(undefined8 *)a0;
  plVar2 = (long *)PyLong_FromUnsignedLong(*in_RDX);
  if (plVar2 == (long *)0x0) {
    throw_error_already_set();
  }
  lVar3 = PyEval_CallFunction(uVar1,"(O)",plVar2);
  if (lVar3 == 0) {
    throw_error_already_set();
  }
  *(long *)this = lVar3;
  if ((plVar2 != (long *)0x0) && (*plVar2 = *plVar2 + -1, *plVar2 == 0)) {
    _Py_Dealloc();
  }
  return (method_result)(handle<_object>)this;
}

Assistant:

detail::method_result
operator()( BOOST_PP_ENUM_BINARY_PARAMS_Z(1, N, A, const& a) ) const
{
    detail::method_result x(
        PyEval_CallFunction(
            this->ptr()
          , const_cast<char*>("(" BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_FIXED, "O") ")")
            BOOST_PP_REPEAT_1ST(N, BOOST_PYTHON_fast_arg_to_python_get, nil)
        ));
    return x;
}